

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O2

char * hdr_gettoken(stbi *z,char *buffer)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    uVar1 = get8(z);
    iVar2 = at_eof(z);
    if ((iVar2 != 0) || ((uVar1 & 0xff) == 10)) goto LAB_0014fea1;
    buffer[lVar3] = (char)uVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x3ff);
  lVar3 = 0x3ff;
  do {
    iVar2 = at_eof(z);
    if (iVar2 != 0) break;
    iVar2 = get8(z);
  } while (iVar2 != 10);
LAB_0014fea1:
  buffer[lVar3] = '\0';
  return buffer;
}

Assistant:

static char *hdr_gettoken(stbi *z, char *buffer)
{
   int len=0;
	//char *s = buffer,
	char c = '\0';

   c = get8(z);

	while (!at_eof(z) && c != '\n') {
		buffer[len++] = c;
      if (len == HDR_BUFLEN-1) {
         // flush to end of line
         while (!at_eof(z) && get8(z) != '\n')
            ;
         break;
      }
      c = get8(z);
	}

   buffer[len] = 0;
	return buffer;
}